

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

Ssw_Cla_t * Ssw_ClassesStart(Aig_Man_t *pAig)

{
  Vec_Ptr_t *pVVar1;
  Ssw_Cla_t *pSVar2;
  Aig_Obj_t ***pppAVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  size_t __nmemb;
  
  pSVar2 = (Ssw_Cla_t *)malloc(0x70);
  pSVar2->pAig = (Aig_Man_t *)0x0;
  pSVar2->pId2Class = (Aig_Obj_t ***)0x0;
  pSVar2->pClassSizes = (int *)0x0;
  pSVar2->fConstCorr = 0;
  pSVar2->nClasses = 0;
  pSVar2->nCands1 = 0;
  pSVar2->nLits = 0;
  pSVar2->pMemClasses = (Aig_Obj_t **)0x0;
  pSVar2->pMemClassesFree = (Aig_Obj_t **)0x0;
  pSVar2->vClassOld = (Vec_Ptr_t *)0x0;
  pSVar2->vClassNew = (Vec_Ptr_t *)0x0;
  pSVar2->vRefined = (Vec_Ptr_t *)0x0;
  pSVar2->pManData = (void *)0x0;
  pSVar2->pFuncNodeHash = (_func_uint_void_ptr_Aig_Obj_t_ptr *)0x0;
  pSVar2->pFuncNodeIsConst = (_func_int_void_ptr_Aig_Obj_t_ptr *)0x0;
  pSVar2->pFuncNodesAreEqual = (_func_int_void_ptr_Aig_Obj_t_ptr_Aig_Obj_t_ptr *)0x0;
  pSVar2->pAig = pAig;
  pVVar1 = pAig->vObjs;
  __nmemb = (size_t)pVVar1->nSize;
  pppAVar3 = (Aig_Obj_t ***)calloc(__nmemb,8);
  pSVar2->pId2Class = pppAVar3;
  piVar4 = (int *)calloc(__nmemb,4);
  pSVar2->pClassSizes = piVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pSVar2->vClassOld = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pSVar2->vClassNew = pVVar5;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pSVar2->vRefined = pVVar5;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,pVVar1->nSize);
  }
  return pSVar2;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesStart( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    p = ABC_ALLOC( Ssw_Cla_t, 1 );
    memset( p, 0, sizeof(Ssw_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->vRefined     = Vec_PtrAlloc( 1000 );
    if ( pAig->pReprs == NULL )
        Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}